

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetInteger64Verifier::verifyFloatRange
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLfloat min,GLfloat max)

{
  long lVar1;
  GLint64 GVar2;
  bool bVar3;
  qpTestResult qVar4;
  long (*palVar5) [2];
  TestLog *this_00;
  MessageBuilder *pMVar6;
  MessageBuilder local_1e8;
  undefined1 local_68 [8];
  StateQueryMemoryWriteGuard<long[2]> range;
  GLint64 testRangeAsGLint [2];
  GLfloat max_local;
  GLfloat min_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetInteger64Verifier *this_local;
  
  testRangeAsGLint[1]._4_4_ = max;
  range.m_postguard[1] = deqp::gls::StateQueryUtil::roundGLfloatToNearestIntegerHalfUp<long>(min);
  testRangeAsGLint[0] =
       deqp::gls::StateQueryUtil::roundGLfloatToNearestIntegerHalfDown<long>
                 (testRangeAsGLint[1]._4_4_);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[2]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<long[2]> *)local_68);
  palVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_68);
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,name,*palVar5);
  bVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[2]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<long[2]> *)local_68,testCtx);
  lVar1 = range.m_postguard[1];
  if ((bVar3) &&
     ((palVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_68),
      GVar2 = testRangeAsGLint[0], lVar1 < (*palVar5)[0] ||
      (palVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_68),
      (*palVar5)[1] < GVar2)))) {
    this_00 = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1e8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_1e8,(char (*) [18])"// ERROR: range [");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,range.m_postguard + 1);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0xafd70f);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,testRangeAsGLint);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xacaf61);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [19])0xad854b);
    palVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_68);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,*palVar5);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0xafd70f);
    palVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_68);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,*palVar5 + 1);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xacaf61);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e8);
    qVar4 = tcu::TestContext::getTestResult(testCtx);
    if (qVar4 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer range");
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyFloatRange (tcu::TestContext& testCtx, GLenum name, GLfloat min, GLfloat max)
{
	using tcu::TestLog;

	const GLint64 testRangeAsGLint[] =
	{
		StateQueryUtil::roundGLfloatToNearestIntegerHalfUp<GLint64>(min),
		StateQueryUtil::roundGLfloatToNearestIntegerHalfDown<GLint64>(max)
	};

	StateQueryMemoryWriteGuard<GLint64[2]> range;
	glGetInteger64v(name, range);

	if (!range.verifyValidity(testCtx))
		return;

	// check if test range outside of gl state range
	if (testRangeAsGLint[0] < range[0] ||
		testRangeAsGLint[1] > range[1])
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: range ["
			<< testRangeAsGLint[0] << ", "
			<< testRangeAsGLint[1] << "]"
			<< " is not in range ["
			<< range[0] << ", "
			<< range[1] << "]" << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer range");
	}
}